

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O3

void __thiscall Lexico::AnalisadorLexico(Lexico *this)

{
  Lexico *this_00;
  bool bVar1;
  int iVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  char ch;
  vector<char,_std::allocator<char>_> caracter;
  string palavra;
  ifstream fin;
  char local_2a1;
  Lexico *local_2a0;
  char *local_298;
  iterator iStack_290;
  char *local_288;
  undefined1 *local_280;
  long local_278;
  undefined1 local_270;
  undefined7 uStack_26f;
  string local_260;
  int (*local_240) [35];
  long local_238 [65];
  
  local_2a0 = this;
  std::ifstream::ifstream
            (local_238,"/media/augusto/Augusto/Documentos/Codigos/simple-parser/test.txt",_S_in);
  local_298 = (char *)0x0;
  iStack_290._M_current = (char *)0x0;
  local_288 = (char *)0x0;
  while (plVar3 = (long *)std::istream::get((char *)local_238),
        (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    if (iStack_290._M_current == local_288) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                ((vector<char,std::allocator<char>> *)&local_298,iStack_290,&local_2a1);
    }
    else {
      *iStack_290._M_current = local_2a1;
      iStack_290._M_current = iStack_290._M_current + 1;
    }
  }
  std::ios::clear((int)local_238 + (int)*(undefined8 *)(local_238[0] + -0x18));
  std::ifstream::close();
  local_280 = &local_270;
  local_278 = 0;
  local_270 = 0;
  if (iStack_290._M_current == local_298) {
    uVar7 = 0;
  }
  else {
    local_240 = local_2a0->automato;
    uVar5 = 0;
    iVar8 = 0;
    uVar7 = 0;
    uVar6 = 1;
    do {
      iVar2 = PosicaoIndice(local_2a0,local_298[uVar5]);
      uVar9 = uVar6;
      if (iVar2 == -1) {
        uVar9 = 0;
      }
      if (uVar6 == 1) {
        uVar9 = uVar6;
      }
      uVar4 = 0x3c;
      if (uVar9 != 1) {
        uVar4 = uVar9;
      }
      if (iVar2 != -1) {
        uVar4 = local_240[(int)uVar6][iVar2];
      }
      uVar6 = uVar4;
      uVar9 = uVar7;
      if (1 < uVar6) {
        uVar9 = uVar6;
      }
      if (uVar6 == 0) {
        if ((uVar7 == 0x2c) || (uVar7 == 2)) {
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_260,local_280,local_280 + local_278);
          bVar1 = Tokens::IsReservada(&local_2a0->super_Tokens,&local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if (!bVar1) {
            Tokens::setToken(&local_2a0->super_Tokens,2,(int)local_278);
          }
          local_278 = 0;
          *local_280 = 0;
        }
        else {
          Token(local_2a0,uVar7);
        }
        uVar7 = 0;
        uVar6 = 1;
      }
      else {
        uVar7 = uVar9;
        if (uVar6 == 2) {
          std::__cxx11::string::push_back((char)&local_280);
          iVar8 = iVar8 + 1;
          uVar6 = 2;
        }
        else {
          if (uVar6 == 0x3c) {
            std::operator<<((ostream *)&std::cout,"\nExpected caracter valid!!\n\n");
            exit(0);
          }
          iVar8 = iVar8 + 1;
        }
      }
      uVar5 = (ulong)iVar8;
    } while (uVar5 < (ulong)((long)iStack_290._M_current - (long)local_298));
  }
  this_00 = local_2a0;
  Token(local_2a0,uVar7);
  Tokens::Inverter(&this_00->super_Tokens);
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
  }
  if (local_298 != (char *)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Lexico::AnalisadorLexico() {
  ifstream fin ("/media/augusto/Augusto/Documentos/Codigos/simple-parser/test.txt", ifstream::in);
  vector<char> caracter;
  char ch;
  int i, j;

  while (fin.get(ch)) {
    caracter.push_back(ch);
  }

  fin.clear();
  fin.close();
  int current_state = 1;
  int final_state = 0;
  int indice_caracter;
  string palavra;
  i = j = 0;
  while (i < caracter.size()) {
    indice_caracter = PosicaoIndice(caracter[i]);
    // cout << " " << caracter[i] << " | " << current_state << " -> " << indice_caracter << "\n";
    if (indice_caracter == -1 && current_state != 1) current_state = 0;
    if (indice_caracter == -1 && current_state == 1) current_state = estado_erro;
    if (indice_caracter != -1) current_state = automato[current_state][indice_caracter];

    if (isFinal(current_state)) final_state = current_state;

        // cout << caracter[i];
    if (current_state != 0) {
      if (current_state == 2 ) {
       palavra.push_back(caracter[i]);
      }
      i++;
    }
    if (current_state == estado_erro) {
      cout << "\nExpected caracter valid!!\n\n";
      exit(0);
    }
    if (current_state == 0) {
      if (final_state == 2 || final_state == UNDER) {
        // cout << "palavra: " << palavra << "\n";
        if (Tokens::IsReservada(palavra));
        else Tokens::setToken(2, palavra.size());
        palavra.clear();
      }
      else Token(final_state);
      current_state = 1;
      final_state = 0;
    }
  }
  Token (final_state);
  Inverter();
}